

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::
FormatString<char[31],char_const*,char[24],unsigned_int,char[13],unsigned_long,char[37],unsigned_int,char[45]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [31],char **Args_1,
          char (*Args_2) [24],uint *Args_3,char (*Args_4) [13],unsigned_long *Args_5,
          char (*Args_6) [37],uint *Args_7,char (*Args_8) [45])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[31],char_const*,char[24],unsigned_int,char[13],unsigned_long,char[37],unsigned_int,char[45]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [31])this,(char **)Args,(char (*) [24])Args_1,(uint *)Args_2,
             (char (*) [13])Args_3,(unsigned_long *)Args_4,(char (*) [37])Args_5,(uint *)Args_6,
             (char (*) [45])Args_7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}